

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O0

int IDAQuadSensReInit(void *ida_mem,N_Vector *yQS0)

{
  int iVar1;
  long in_RSI;
  IDAMem in_RDI;
  int retval;
  int is;
  IDAMem IDA_mem;
  int local_24;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x794,"IDAQuadSensReInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RDI->ida_sensi == 0) {
    IDAProcessError(in_RDI,-0x28,0x79e,"IDAQuadSensReInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                    ,"Illegal attempt to call before calling IDASensInit.");
    local_4 = -0x28;
  }
  else if (in_RDI->ida_quadSensMallocDone == 0) {
    IDAProcessError(in_RDI,-0x32,0x7a7,"IDAQuadSensReInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                    ,"Forward sensitivity analysis for quadrature variables was not activated.");
    local_4 = -0x32;
  }
  else if (in_RSI == 0) {
    IDAProcessError((IDAMem)0x0,-0x16,0x7b0,"IDAQuadSensReInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                    ,"yQS0 = NULL illegal parameter.");
    local_4 = -0x16;
  }
  else {
    for (local_24 = 0; local_24 < in_RDI->ida_Ns; local_24 = local_24 + 1) {
      in_RDI->ida_cvals[local_24] = 1.0;
    }
    iVar1 = N_VScaleVectorArray(in_RDI->ida_Ns,in_RDI->ida_cvals,in_RSI,in_RDI->ida_phiQS[0]);
    if (iVar1 == 0) {
      in_RDI->ida_nrQSe = 0;
      in_RDI->ida_nrQeS = 0;
      in_RDI->ida_netfQS = 0;
      in_RDI->ida_quadr_sensi = 1;
      local_4 = 0;
    }
    else {
      local_4 = -0x1c;
    }
  }
  return local_4;
}

Assistant:

int IDAQuadSensReInit(void* ida_mem, N_Vector* yQS0)
{
  IDAMem IDA_mem;
  int is, retval;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  /* Check if sensitivity analysis is active */
  if (!IDA_mem->ida_sensi)
  {
    IDAProcessError(IDA_mem, IDA_NO_SENS, __LINE__, __func__, __FILE__,
                    MSG_NO_SENSI);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_NO_SENS);
  }

  /* Was sensitivity for quadrature already initialized? */
  if (!IDA_mem->ida_quadSensMallocDone)
  {
    IDAProcessError(IDA_mem, IDA_NO_QUADSENS, __LINE__, __func__, __FILE__,
                    MSG_NO_QUADSENSI);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_NO_QUADSENS);
  }

  /* Verify yQS0 parameter. */
  if (yQS0 == NULL)
  {
    IDAProcessError(NULL, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_NULL_YQS0);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* Error checking complete at this point. */

  /* Initialize phiQS[0] in the history array */
  for (is = 0; is < IDA_mem->ida_Ns; is++) { IDA_mem->ida_cvals[is] = ONE; }

  retval = N_VScaleVectorArray(IDA_mem->ida_Ns, IDA_mem->ida_cvals, yQS0,
                               IDA_mem->ida_phiQS[0]);
  if (retval != IDA_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_VECTOROP_ERR);
  }

  /* Initialize all sensitivities related counters. */
  IDA_mem->ida_nrQSe  = 0;
  IDA_mem->ida_nrQeS  = 0;
  IDA_mem->ida_netfQS = 0;

  /* Everything all right, set the flags and return with success. */
  IDA_mem->ida_quadr_sensi = SUNTRUE;

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (IDA_SUCCESS);
}